

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O0

int __thiscall adios2::fstream::open(fstream *this,char *__file,int __oflag,...)

{
  undefined4 uVar1;
  int iVar2;
  char (*in_RCX) [4];
  char *__r;
  shared_ptr<adios2::core::Stream> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  Mode *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  adios2::fstream::CheckOpen((string *)this);
  uVar1 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI((ompi_communicator_t *)&stack0xffffffffffffffb0);
  __r = "C++";
  std::
  make_shared<adios2::core::Stream,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[4]>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (Comm *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_RCX);
  std::shared_ptr<adios2::core::Stream>::operator=
            (in_stack_ffffffffffffff70,(shared_ptr<adios2::core::Stream> *)__r);
  std::shared_ptr<adios2::core::Stream>::~shared_ptr((shared_ptr<adios2::core::Stream> *)0x10ac32);
  iVar2 = adios2::helper::Comm::~Comm((Comm *)&stack0xffffffffffffffb0);
  return iVar2;
}

Assistant:

void fstream::open(const std::string &name, const openmode mode, MPI_Comm comm,
                   const std::string configFile, const std::string ioInConfigFile)
{
    CheckOpen(name);
    m_Stream = std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm),
                                              configFile, ioInConfigFile, "C++");
}